

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::HasOwnPropertyNoHostObject(Var instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6bd,"(!TaggedNumber::Is(instance))",
                                "HasOwnPropertyNoHostObject int passed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pRVar6 = VarTo<Js::RecyclableObject>(instance);
  if (pRVar6 == (RecyclableObject *)0x0) {
    uVar4 = 0;
  }
  else {
    iVar3 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xd])(pRVar6,propertyId);
    uVar4 = (uint)(iVar3 != 0);
  }
  return uVar4;
}

Assistant:

BOOL JavascriptOperators::HasOwnPropertyNoHostObject(Var instance, PropertyId propertyId)
    {
        AssertMsg(!TaggedNumber::Is(instance), "HasOwnPropertyNoHostObject int passed");

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        return object && object->HasOwnPropertyNoHostObject(propertyId);
    }